

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldGeneratorBase *pFVar2;
  long lVar3;
  long lVar4;
  
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public void WriteTo(pb::CodedOutputStream output) {\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"output.WriteRawMessage(this);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#else\n");
  io::Printer::Indent(printer);
  GenerateWriteToBody(this,printer,false);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#endif\n");
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>
            (printer,"void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) {\n");
  io::Printer::Indent(printer);
  GenerateWriteToBody(this,printer,true);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Print<>(printer,"#endif\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public int CalculateSize() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"int size = 0;\n");
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 4)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pFVar2 = CreateFieldGeneratorInternal
                         (this,(FieldDescriptor *)(*(long *)(pDVar1 + 0x28) + lVar3));
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xc])(pFVar2,printer);
      (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar2);
      lVar4 = lVar4 + 1;
      pDVar1 = this->descriptor_;
      lVar3 = lVar3 + 0x48;
    } while (lVar4 < *(int *)(pDVar1 + 4));
  }
  if (this->has_extension_ranges_ != false) {
    io::Printer::Print<>
              (printer,"if (_extensions != null) {\n  size += _extensions.CalculateSize();\n}\n");
  }
  io::Printer::Print<>
            (printer,"if (_unknownFields != null) {\n  size += _unknownFields.CalculateSize();\n}\n"
            );
  io::Printer::Print<>(printer,"return size;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateMessageSerializationMethods(io::Printer* printer) {
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public void WriteTo(pb::CodedOutputStream output) {\n");
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Indent();
  printer->Print("output.WriteRawMessage(this);\n");
  printer->Outdent();
  printer->Print("#else\n");
  printer->Indent();
  GenerateWriteToBody(printer, false);
  printer->Outdent();
  printer->Print("#endif\n");
  printer->Print("}\n\n");

  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print("void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) {\n");
  printer->Indent();
  GenerateWriteToBody(printer, true);
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endif\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    "public int CalculateSize() {\n");
  printer->Indent();
  printer->Print("int size = 0;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->GenerateSerializedSizeCode(printer);
  }

  if (has_extension_ranges_) {
    printer->Print(
      "if (_extensions != null) {\n"
      "  size += _extensions.CalculateSize();\n"
      "}\n");
  }

  printer->Print(
    "if (_unknownFields != null) {\n"
    "  size += _unknownFields.CalculateSize();\n"
    "}\n");

  printer->Print("return size;\n");
  printer->Outdent();
  printer->Print("}\n\n");
}